

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lstm.cpp
# Opt level: O3

int ncnn::lstm_int8(Mat *bottom_blob,Mat *top_blob,int reverse,Mat *weight_xc_int8,
                   float *weight_xc_int8_scales,Mat *bias_c,Mat *weight_hc_int8,
                   float *weight_hc_int8_scales,Mat *weight_hr,Mat *hidden_state,Mat *cell_state,
                   Option *opt)

{
  undefined4 uVar1;
  undefined1 uVar2;
  undefined1 uVar3;
  undefined1 uVar4;
  undefined1 uVar5;
  undefined1 uVar6;
  undefined1 uVar8;
  undefined1 uVar10;
  undefined1 uVar12;
  undefined1 uVar14;
  undefined1 uVar16;
  undefined1 uVar18;
  undefined1 uVar20;
  uint _w;
  uint _h;
  uint _w_00;
  uint _h_00;
  size_t sVar21;
  undefined1 auVar22 [16];
  undefined1 auVar23 [14];
  undefined1 auVar24 [14];
  undefined1 auVar25 [14];
  undefined1 auVar26 [14];
  uint uVar27;
  undefined4 uVar28;
  undefined1 uVar29;
  undefined1 uVar31;
  undefined1 uVar33;
  undefined1 uVar35;
  int *piVar36;
  undefined1 auVar37 [14];
  undefined1 auVar38 [14];
  uint uVar39;
  void *pvVar40;
  long lVar41;
  void *pvVar42;
  ulong uVar43;
  ulong uVar44;
  long lVar45;
  void *pvVar46;
  ulong uVar47;
  uint uVar48;
  void *pvVar49;
  ulong uVar50;
  long lVar51;
  void *pvVar52;
  ulong uVar53;
  void *pvVar54;
  long lVar55;
  ulong uVar56;
  void *pvVar57;
  void *pvVar58;
  void *pvVar59;
  float *pfVar60;
  int iVar61;
  int iVar62;
  void *pvVar63;
  float fVar64;
  float fVar65;
  float fVar67;
  float fVar68;
  float fVar69;
  undefined1 auVar66 [16];
  float fVar70;
  float fVar71;
  int iVar73;
  float fVar74;
  int iVar75;
  float fVar76;
  int iVar77;
  float fVar78;
  undefined1 auVar72 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  Option opt_quant;
  Option opt_quant_1;
  Mat local_258;
  Mat local_208;
  Mat local_1b8;
  Mat local_168;
  Mat local_118;
  Mat local_c8;
  undefined1 local_78 [72];
  undefined1 auVar86 [12];
  undefined8 uVar7;
  undefined7 uVar9;
  undefined6 uVar11;
  undefined5 uVar13;
  undefined4 uVar15;
  undefined3 uVar17;
  undefined2 uVar19;
  undefined4 uVar30;
  undefined3 uVar32;
  undefined2 uVar34;
  
  _w = bottom_blob->w;
  _h = bottom_blob->h;
  _w_00 = top_blob->w;
  uVar43 = (ulong)_w_00;
  _h_00 = cell_state->w;
  uVar47 = (ulong)_h_00;
  local_208.cstep = 0;
  local_208.data = (void *)0x0;
  local_208.refcount._0_4_ = 0;
  local_208.refcount._4_4_ = 0;
  local_208.elemsize._0_4_ = 0;
  local_208.elemsize._4_4_ = 0;
  local_208.elempack = 0;
  local_208.allocator = (Allocator *)0x0;
  local_208.dims = 0;
  local_208.w = 0;
  local_208.h = 0;
  local_208.d = 0;
  local_208.c = 0;
  Mat::create(&local_208,4,_h_00,4,opt->workspace_allocator);
  iVar61 = -100;
  if ((local_208.data == (void *)0x0) || ((long)local_208.c * local_208.cstep == 0))
  goto LAB_003539ff;
  local_258.cstep = 0;
  local_258.data = (void *)0x0;
  local_258.refcount._0_4_ = 0;
  local_258.refcount._4_4_ = 0;
  local_258.elemsize._0_4_ = 0;
  local_258._20_8_ = 0;
  local_258.allocator = (Allocator *)0x0;
  local_258.dims = 0;
  local_258.w = 0;
  local_258.h = 0;
  local_258.d = 0;
  local_258.c = 0;
  if (_w_00 == _h_00) {
LAB_00353054:
    local_118.cstep = 0;
    local_118.data = (void *)0x0;
    local_118.refcount._0_4_ = 0;
    local_118.refcount._4_4_ = 0;
    local_118.elemsize._0_4_ = 0;
    local_118.elemsize._4_4_ = 0;
    local_118.elempack = 0;
    local_118.allocator = (Allocator *)0x0;
    local_118.dims = 0;
    local_118.w = 0;
    local_118.h = 0;
    local_118.d = 0;
    local_118.c = 0;
    Mat::create(&local_118,_w,_h,1,1,opt->workspace_allocator);
    local_c8.cstep = 0;
    local_c8.data = (void *)0x0;
    local_c8.refcount._0_4_ = 0;
    local_c8.refcount._4_4_ = 0;
    local_c8.elemsize._0_4_ = 0;
    local_c8._20_8_ = 0;
    local_c8.allocator = (Allocator *)0x0;
    local_c8.dims = 0;
    local_c8.w = 0;
    local_c8.h = 0;
    local_c8.d = 0;
    local_c8.c = 0;
    Mat::create(&local_c8,_h,4,1,opt->workspace_allocator);
    if (0 < (int)_h) {
      pvVar40 = bottom_blob->data;
      iVar61 = bottom_blob->w;
      sVar21 = bottom_blob->elemsize;
      uVar50 = 0;
      do {
        fVar64 = 0.0;
        if (0 < (int)_w) {
          uVar53 = 0;
          do {
            fVar70 = ABS(*(float *)((long)pvVar40 + uVar53 * 4));
            if (fVar64 <= fVar70) {
              fVar64 = fVar70;
            }
            uVar53 = uVar53 + 1;
          } while (_w != uVar53);
        }
        *(float *)((long)local_c8.data + uVar50 * 4) = 127.0 / fVar64;
        uVar50 = uVar50 + 1;
        pvVar40 = (void *)((long)pvVar40 + (long)iVar61 * sVar21);
      } while (uVar50 != _h);
    }
    local_1b8.data = *(void **)opt;
    uVar28 = opt->openmp_blocktime;
    uVar29 = opt->use_winograd_convolution;
    uVar31 = opt->use_sgemm_convolution;
    uVar33 = opt->use_int8_inference;
    uVar35 = opt->use_vulkan_compute;
    uVar34 = CONCAT11(uVar35,uVar33);
    uVar32 = CONCAT21(uVar34,uVar31);
    uVar30 = CONCAT31(uVar32,uVar29);
    uVar50._0_1_ = opt->use_bf16_storage;
    uVar50._1_1_ = opt->use_fp16_packed;
    uVar50._2_1_ = opt->use_fp16_storage;
    uVar50._3_1_ = opt->use_fp16_arithmetic;
    uVar50._4_1_ = opt->use_int8_packed;
    uVar50._5_1_ = opt->use_int8_storage;
    uVar50._6_1_ = opt->use_int8_arithmetic;
    uVar50._7_1_ = opt->use_packing_layout;
    local_1b8.dims = opt->vulkan_device_index;
    local_1b8.w._0_1_ = opt->use_reserved_1;
    local_1b8.w._1_1_ = opt->use_image_storage;
    local_1b8.w._2_1_ = opt->use_tensor_storage;
    local_1b8.w._3_1_ = opt->use_reserved_2;
    uVar1 = opt->flush_denormals;
    uVar2 = opt->use_local_pool_allocator;
    uVar3 = opt->use_shader_local_memory;
    uVar4 = opt->use_cooperative_matrix;
    uVar5 = opt->use_winograd23_convolution;
    uVar6 = opt->use_winograd43_convolution;
    uVar8 = opt->use_winograd63_convolution;
    uVar10 = opt->use_a53_a55_optimized_kernel;
    uVar12 = opt->use_fp16_uniform;
    uVar14 = opt->use_int8_uniform;
    uVar16 = opt->use_reserved_9;
    uVar18 = opt->use_reserved_10;
    uVar20 = opt->use_reserved_11;
    uVar19 = CONCAT11(uVar20,uVar18);
    uVar17 = CONCAT21(uVar19,uVar16);
    uVar15 = CONCAT31(uVar17,uVar14);
    uVar13 = CONCAT41(uVar15,uVar12);
    uVar11 = CONCAT51(uVar13,uVar10);
    uVar9 = CONCAT61(uVar11,uVar8);
    uVar7 = CONCAT71(uVar9,uVar6);
    auVar86._4_8_ = uVar7;
    auVar86[3] = uVar5;
    auVar86[2] = uVar4;
    auVar86[1] = uVar3;
    auVar86[0] = uVar2;
    local_1b8.d = auVar86._0_4_;
    local_1b8.c = (int)uVar7;
    local_1b8.elemsize._0_4_ = SUB84(opt->workspace_allocator,0);
    local_1b8.elemsize._4_4_ = (undefined4)((ulong)opt->workspace_allocator >> 0x20);
    local_1b8.refcount._0_4_ = SUB84(opt->workspace_allocator,0);
    local_1b8.refcount._4_4_ = (undefined4)((ulong)opt->workspace_allocator >> 0x20);
    local_1b8.allocator = (Allocator *)(uVar50 & 0xffffffffffffff);
    local_1b8.elempack = uVar28;
    local_1b8._28_4_ = uVar30;
    local_1b8.h = uVar1;
    local_1b8._60_4_ = uVar15;
    quantize_to_int8(bottom_blob,&local_118,&local_c8,(Option *)&local_1b8);
    local_1b8.cstep = 0;
    local_1b8.data = (void *)0x0;
    local_1b8.refcount._0_4_ = 0;
    local_1b8.refcount._4_4_ = 0;
    local_1b8.elemsize._0_4_ = 0;
    local_1b8.elemsize._4_4_ = 0;
    local_1b8.elempack = 0;
    local_1b8.allocator = (Allocator *)0x0;
    local_1b8.dims = 0;
    local_1b8.w = 0;
    local_1b8.h = 0;
    local_1b8.d = 0;
    local_1b8.c = 0;
    Mat::create(&local_1b8,_w_00,1,1,opt->workspace_allocator);
    local_168.cstep = 0;
    local_168.data = (float *)0x0;
    local_168.refcount._0_4_ = 0;
    local_168.refcount._4_4_ = 0;
    local_168.elemsize._0_4_ = 0;
    local_168._20_8_ = 0;
    local_168.allocator = (Allocator *)0x0;
    local_168.dims = 0;
    local_168.w = 0;
    local_168.h = 0;
    local_168.d = 0;
    local_168.c = 0;
    Mat::create(&local_168,1,4,1,opt->workspace_allocator);
    if (0 < (int)_h) {
      uVar50 = (ulong)(_h_00 * 2);
      uVar53 = (ulong)(_h_00 * 3);
      uVar39 = 0;
      do {
        uVar48 = ~uVar39 + _h;
        if (reverse == 0) {
          uVar48 = uVar39;
        }
        if ((int)_w_00 < 1) {
LAB_00353282:
          *(float *)local_168.data = 1.0;
          if (0 < local_1b8.c * (int)local_1b8.cstep) {
            memset(local_1b8.data,0,(ulong)(uint)(local_1b8.c * (int)local_1b8.cstep));
          }
        }
        else {
          fVar64 = 0.0;
          uVar44 = 0;
          do {
            fVar70 = ABS(*(float *)((long)hidden_state->data + uVar44 * 4));
            if (fVar64 <= fVar70) {
              fVar64 = fVar70;
            }
            uVar44 = uVar44 + 1;
          } while (uVar43 != uVar44);
          if (fVar64 == 0.0) goto LAB_00353282;
          *(float *)local_168.data = 127.0 / fVar64;
          local_78[0] = opt->lightmode;
          local_78[1] = opt->use_shader_pack8;
          local_78[2] = opt->use_subgroup_ops;
          local_78[3] = opt->use_reserved_0;
          local_78._4_4_ = opt->num_threads;
          local_78._16_8_ = opt->workspace_allocator;
          local_78._24_4_ = opt->openmp_blocktime;
          local_78[0x1c] = opt->use_winograd_convolution;
          local_78[0x1d] = opt->use_sgemm_convolution;
          local_78[0x1e] = opt->use_int8_inference;
          local_78[0x1f] = opt->use_vulkan_compute;
          local_78[0x20] = opt->use_bf16_storage;
          local_78[0x21] = opt->use_fp16_packed;
          local_78[0x22] = opt->use_fp16_storage;
          local_78[0x23] = opt->use_fp16_arithmetic;
          uVar27._0_1_ = opt->use_int8_packed;
          uVar27._1_1_ = opt->use_int8_storage;
          uVar27._2_1_ = opt->use_int8_arithmetic;
          uVar27._3_1_ = opt->use_packing_layout;
          local_78._40_4_ = opt->vulkan_device_index;
          local_78[0x2c] = opt->use_reserved_1;
          local_78[0x2d] = opt->use_image_storage;
          local_78[0x2e] = opt->use_tensor_storage;
          local_78[0x2f] = opt->use_reserved_2;
          local_78._48_4_ = opt->flush_denormals;
          local_78[0x34] = opt->use_local_pool_allocator;
          local_78[0x35] = opt->use_shader_local_memory;
          local_78[0x36] = opt->use_cooperative_matrix;
          local_78[0x37] = opt->use_winograd23_convolution;
          local_78[0x38] = opt->use_winograd43_convolution;
          local_78[0x39] = opt->use_winograd63_convolution;
          local_78[0x3a] = opt->use_a53_a55_optimized_kernel;
          local_78[0x3b] = opt->use_fp16_uniform;
          local_78[0x3c] = opt->use_int8_uniform;
          local_78[0x3d] = opt->use_reserved_9;
          local_78[0x3e] = opt->use_reserved_10;
          local_78[0x3f] = opt->use_reserved_11;
          local_78._8_8_ = opt->workspace_allocator;
          local_78._36_4_ = uVar27 & 0xffffff;
          quantize_to_int8(hidden_state,&local_1b8,&local_168,(Option *)local_78);
        }
        pvVar40 = local_258.data;
        lVar45 = (long)(int)uVar48;
        if ((int)_h_00 < 1) {
          pvVar63 = (void *)(top_blob->w * lVar45 * top_blob->elemsize + (long)top_blob->data);
        }
        else {
          fVar64 = 1.0 / *local_168.data;
          fVar70 = 1.0 / *(float *)((long)local_c8.data + lVar45 * 4);
          pvVar63 = bias_c->data;
          lVar41 = (long)bias_c->w * bias_c->elemsize;
          pvVar57 = weight_xc_int8->data;
          pvVar42 = weight_hc_int8->data;
          lVar51 = (long)weight_xc_int8->w * weight_xc_int8->elemsize;
          pvVar58 = (void *)(lVar51 * uVar53 + (long)pvVar57);
          pvVar59 = (void *)(lVar51 * uVar50 + (long)pvVar57);
          pvVar52 = (void *)(lVar51 * uVar47 + (long)pvVar57);
          lVar55 = (long)weight_hc_int8->w * weight_hc_int8->elemsize;
          pvVar49 = (void *)(lVar55 * uVar53 + (long)pvVar42);
          pvVar54 = (void *)(lVar55 * uVar50 + (long)pvVar42);
          pvVar46 = (void *)(lVar55 * uVar47 + (long)pvVar42);
          uVar44 = 0;
          do {
            fVar71 = 0.0;
            fVar74 = 0.0;
            fVar76 = 0.0;
            fVar78 = 0.0;
            fVar65 = 0.0;
            fVar67 = 0.0;
            fVar68 = 0.0;
            fVar69 = 0.0;
            if (0 < (int)_w) {
              uVar56 = 0;
              do {
                iVar61 = (int)*(char *)((long)local_118.data +
                                       uVar56 + local_118.w * lVar45 *
                                                CONCAT44(local_118.elemsize._4_4_,
                                                         (undefined4)local_118.elemsize));
                auVar83._4_4_ = iVar61;
                auVar83._0_4_ = iVar61;
                auVar83._8_4_ = iVar61;
                auVar83._12_4_ = iVar61;
                auVar81._8_8_ = 0;
                auVar81._0_8_ =
                     (ulong)((uint)*(byte *)((long)pvVar57 + uVar56) << 8 |
                            (uint)*(byte *)((long)pvVar52 + uVar56) << 0x18) |
                     (ulong)*(byte *)((long)pvVar59 + uVar56) << 0x28 |
                     (ulong)*(byte *)((long)pvVar58 + uVar56) << 0x38;
                auVar81 = psraw(auVar81,8);
                auVar23._10_2_ = 0;
                auVar23._0_10_ = auVar81._0_10_;
                auVar23._12_2_ = auVar81._6_2_;
                auVar25._8_2_ = auVar81._4_2_;
                auVar25._0_8_ = auVar81._0_8_;
                auVar25._10_4_ = auVar23._10_4_;
                auVar37._6_8_ = 0;
                auVar37._0_6_ = auVar25._8_6_;
                auVar82._6_8_ = SUB148(auVar37 << 0x40,6);
                auVar82._4_2_ = auVar81._2_2_;
                auVar82._0_2_ = auVar81._0_2_;
                auVar82._2_2_ = 0;
                auVar82._14_2_ = 0;
                auVar83 = pmaddwd(auVar82,auVar83);
                fVar65 = (float)((int)fVar65 + auVar83._0_4_);
                fVar67 = (float)((int)fVar67 + auVar83._4_4_);
                fVar68 = (float)((int)fVar68 + auVar83._8_4_);
                fVar69 = (float)((int)fVar69 + auVar83._12_4_);
                uVar56 = uVar56 + 1;
              } while (_w != uVar56);
              fVar65 = (float)(int)fVar65;
              fVar67 = (float)(int)fVar67;
              fVar68 = (float)(int)fVar68;
              fVar69 = (float)(int)fVar69;
            }
            if (0 < (int)_w_00) {
              iVar61 = 0;
              iVar73 = 0;
              iVar75 = 0;
              iVar77 = 0;
              uVar56 = 0;
              do {
                iVar62 = (int)*(char *)((long)local_1b8.data + uVar56);
                auVar79._4_4_ = iVar62;
                auVar79._0_4_ = iVar62;
                auVar79._8_4_ = iVar62;
                auVar79._12_4_ = iVar62;
                auVar84._8_8_ = 0;
                auVar84._0_8_ =
                     (ulong)((uint)*(byte *)((long)pvVar42 + uVar56) << 8 |
                            (uint)*(byte *)((long)pvVar46 + uVar56) << 0x18) |
                     (ulong)*(byte *)((long)pvVar54 + uVar56) << 0x28 |
                     (ulong)*(byte *)((long)pvVar49 + uVar56) << 0x38;
                auVar83 = psraw(auVar84,8);
                auVar24._10_2_ = 0;
                auVar24._0_10_ = auVar83._0_10_;
                auVar24._12_2_ = auVar83._6_2_;
                auVar26._8_2_ = auVar83._4_2_;
                auVar26._0_8_ = auVar83._0_8_;
                auVar26._10_4_ = auVar24._10_4_;
                auVar38._6_8_ = 0;
                auVar38._0_6_ = auVar26._8_6_;
                auVar85._6_8_ = SUB148(auVar38 << 0x40,6);
                auVar85._4_2_ = auVar83._2_2_;
                auVar85._0_2_ = auVar83._0_2_;
                auVar85._2_2_ = 0;
                auVar85._14_2_ = 0;
                auVar83 = pmaddwd(auVar85,auVar79);
                iVar61 = iVar61 + auVar83._0_4_;
                iVar73 = iVar73 + auVar83._4_4_;
                iVar75 = iVar75 + auVar83._8_4_;
                iVar77 = iVar77 + auVar83._12_4_;
                uVar56 = uVar56 + 1;
              } while (uVar43 != uVar56);
              fVar71 = (float)iVar61;
              fVar74 = (float)iVar73;
              fVar76 = (float)iVar75;
              fVar78 = (float)iVar77;
            }
            auVar72._0_4_ = fVar71 * fVar64;
            auVar72._4_4_ = fVar74 * fVar64;
            auVar72._8_4_ = fVar76 * fVar64;
            auVar72._12_4_ = fVar78 * fVar64;
            auVar80._4_4_ = weight_hc_int8_scales[uVar44 + uVar47];
            auVar80._0_4_ = weight_hc_int8_scales[uVar44];
            auVar80._12_4_ = weight_hc_int8_scales[uVar44 + uVar53];
            auVar80._8_4_ = weight_hc_int8_scales[uVar50 + uVar44];
            auVar81 = divps(auVar72,auVar80);
            auVar66._0_4_ = fVar65 * fVar70;
            auVar66._4_4_ = fVar67 * fVar70;
            auVar66._8_4_ = fVar68 * fVar70;
            auVar66._12_4_ = fVar69 * fVar70;
            auVar22._4_4_ = weight_xc_int8_scales[uVar44 + uVar47];
            auVar22._0_4_ = weight_xc_int8_scales[uVar44];
            auVar22._8_4_ = weight_xc_int8_scales[uVar50 + uVar44];
            auVar22._12_4_ = weight_xc_int8_scales[uVar44 + uVar53];
            auVar83 = divps(auVar66,auVar22);
            fVar65 = *(float *)((long)pvVar63 + uVar44 * 4 + lVar41 * 3);
            fVar67 = *(float *)((long)pvVar63 + uVar44 * 4 + lVar41 * 2);
            fVar68 = *(float *)((long)pvVar63 + uVar44 * 4 + lVar41);
            pfVar60 = (float *)((long)local_208.data +
                               (long)local_208.w *
                               CONCAT44(local_208.elemsize._4_4_,(undefined4)local_208.elemsize) *
                               uVar44);
            *pfVar60 = *(float *)((long)pvVar63 + uVar44 * 4) + auVar83._0_4_ + auVar81._0_4_;
            pfVar60[1] = fVar68 + auVar83._4_4_ + auVar81._4_4_;
            pfVar60[2] = fVar67 + auVar83._8_4_ + auVar81._8_4_;
            pfVar60[3] = fVar65 + auVar83._12_4_ + auVar81._12_4_;
            uVar44 = uVar44 + 1;
            pvVar58 = (void *)((long)pvVar58 + lVar51);
            pvVar59 = (void *)((long)pvVar59 + lVar51);
            pvVar52 = (void *)((long)pvVar52 + lVar51);
            pvVar57 = (void *)((long)pvVar57 + lVar51);
            pvVar49 = (void *)((long)pvVar49 + lVar55);
            pvVar54 = (void *)((long)pvVar54 + lVar55);
            pvVar46 = (void *)((long)pvVar46 + lVar55);
            pvVar42 = (void *)((long)pvVar42 + lVar55);
          } while (uVar44 != uVar47);
          pvVar63 = (void *)(top_blob->w * lVar45 * top_blob->elemsize + (long)top_blob->data);
          if (0 < (int)_h_00) {
            lVar41 = (long)local_208.w;
            lVar45 = CONCAT44(local_208.elemsize._4_4_,(undefined4)local_208.elemsize);
            pvVar57 = cell_state->data;
            pvVar42 = hidden_state->data;
            pfVar60 = (float *)((long)local_208.data + 0xc);
            uVar44 = 0;
            do {
              fVar64 = *pfVar60;
              fVar70 = pfVar60[-2];
              fVar65 = pfVar60[-1];
              fVar67 = expf(-pfVar60[-3]);
              fVar70 = expf(-fVar70);
              fVar65 = expf(-fVar65);
              fVar64 = tanhf(fVar64);
              fVar64 = fVar64 / (fVar67 + 1.0) +
                       *(float *)((long)pvVar57 + uVar44 * 4) / (fVar70 + 1.0);
              fVar70 = tanhf(fVar64);
              fVar70 = fVar70 / (fVar65 + 1.0);
              *(float *)((long)pvVar57 + uVar44 * 4) = fVar64;
              pvVar46 = pvVar40;
              if (_w_00 == _h_00) {
                *(float *)((long)pvVar42 + uVar44 * 4) = fVar70;
                pvVar46 = pvVar63;
              }
              *(float *)((long)pvVar46 + uVar44 * 4) = fVar70;
              uVar44 = uVar44 + 1;
              pfVar60 = (float *)((long)pfVar60 + lVar41 * lVar45);
            } while (uVar47 != uVar44);
          }
        }
        if (0 < (int)_w_00 && _w_00 != _h_00) {
          iVar61 = weight_hr->w;
          sVar21 = weight_hr->elemsize;
          pvVar40 = weight_hr->data;
          pvVar57 = hidden_state->data;
          uVar44 = 0;
          do {
            fVar64 = 0.0;
            if (0 < (int)_h_00) {
              uVar56 = 0;
              do {
                fVar64 = fVar64 + *(float *)((long)pvVar40 + uVar56 * 4) *
                                  *(float *)((long)local_258.data + uVar56 * 4);
                uVar56 = uVar56 + 1;
              } while (uVar47 != uVar56);
            }
            *(float *)((long)pvVar57 + uVar44 * 4) = fVar64;
            *(float *)((long)pvVar63 + uVar44 * 4) = fVar64;
            uVar44 = uVar44 + 1;
            pvVar40 = (void *)((long)pvVar40 + (long)iVar61 * sVar21);
          } while (uVar44 != uVar43);
        }
        uVar39 = uVar39 + 1;
      } while (uVar39 != _h);
    }
    piVar36 = (int *)CONCAT44(local_168.refcount._4_4_,local_168.refcount._0_4_);
    if (piVar36 != (int *)0x0) {
      LOCK();
      *piVar36 = *piVar36 + -1;
      UNLOCK();
      if (*piVar36 == 0) {
        if (local_168.allocator == (Allocator *)0x0) {
          if ((float *)local_168.data != (float *)0x0) {
            free(local_168.data);
          }
        }
        else {
          (*(local_168.allocator)->_vptr_Allocator[3])();
        }
      }
    }
    piVar36 = (int *)CONCAT44(local_1b8.refcount._4_4_,local_1b8.refcount._0_4_);
    if (piVar36 != (int *)0x0) {
      LOCK();
      *piVar36 = *piVar36 + -1;
      UNLOCK();
      if (*piVar36 == 0) {
        if (local_1b8.allocator == (Allocator *)0x0) {
          if (local_1b8.data != (void *)0x0) {
            free(local_1b8.data);
          }
        }
        else {
          (*(local_1b8.allocator)->_vptr_Allocator[3])();
        }
      }
    }
    piVar36 = (int *)CONCAT44(local_c8.refcount._4_4_,local_c8.refcount._0_4_);
    if (piVar36 != (int *)0x0) {
      LOCK();
      *piVar36 = *piVar36 + -1;
      UNLOCK();
      if (*piVar36 == 0) {
        if (local_c8.allocator == (Allocator *)0x0) {
          if (local_c8.data != (void *)0x0) {
            free(local_c8.data);
          }
        }
        else {
          (*(local_c8.allocator)->_vptr_Allocator[3])();
        }
      }
    }
    piVar36 = (int *)CONCAT44(local_118.refcount._4_4_,local_118.refcount._0_4_);
    if (piVar36 != (int *)0x0) {
      LOCK();
      *piVar36 = *piVar36 + -1;
      UNLOCK();
      if (*piVar36 == 0) {
        if (local_118.allocator == (Allocator *)0x0) {
          if (local_118.data != (void *)0x0) {
            free(local_118.data);
          }
        }
        else {
          (*(local_118.allocator)->_vptr_Allocator[3])();
        }
      }
    }
    iVar61 = 0;
  }
  else {
    Mat::create(&local_258,_h_00,4,opt->workspace_allocator);
    iVar61 = -100;
    if ((local_258.data != (void *)0x0) && ((long)local_258.c * local_258.cstep != 0))
    goto LAB_00353054;
  }
  piVar36 = (int *)CONCAT44(local_258.refcount._4_4_,local_258.refcount._0_4_);
  if (piVar36 != (int *)0x0) {
    LOCK();
    *piVar36 = *piVar36 + -1;
    UNLOCK();
    if (*piVar36 == 0) {
      if (local_258.allocator == (Allocator *)0x0) {
        if (local_258.data != (void *)0x0) {
          free(local_258.data);
        }
      }
      else {
        (*(local_258.allocator)->_vptr_Allocator[3])();
      }
    }
  }
LAB_003539ff:
  piVar36 = (int *)CONCAT44(local_208.refcount._4_4_,local_208.refcount._0_4_);
  if (piVar36 != (int *)0x0) {
    LOCK();
    *piVar36 = *piVar36 + -1;
    UNLOCK();
    if (*piVar36 == 0) {
      if (local_208.allocator == (Allocator *)0x0) {
        if (local_208.data != (void *)0x0) {
          free(local_208.data);
        }
      }
      else {
        (*(local_208.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return iVar61;
}

Assistant:

static int lstm_int8(const Mat& bottom_blob, Mat& top_blob, int reverse, const Mat& weight_xc_int8, const float* weight_xc_int8_scales, const Mat& bias_c, const Mat& weight_hc_int8, const float* weight_hc_int8_scales, const Mat& weight_hr, Mat& hidden_state, Mat& cell_state, const Option& opt)
{
    int size = bottom_blob.w;
    int T = bottom_blob.h;

    int num_output = top_blob.w;
    int hidden_size = cell_state.w;

    // 4 x hidden_size
    Mat gates(4, hidden_size, 4u, opt.workspace_allocator);
    if (gates.empty())
        return -100;

    Mat tmp_hidden_state;
    if (num_output != hidden_size)
    {
        tmp_hidden_state.create(hidden_size, 4u, opt.workspace_allocator);
        if (tmp_hidden_state.empty())
            return -100;
    }

    // dynamic quantize bottom_blob
    Mat bottom_blob_int8(size, T, (size_t)1u, 1, opt.workspace_allocator);
    Mat bottom_blob_int8_scales(T, (size_t)4u, 1, opt.workspace_allocator);
    {
        for (int t = 0; t < T; t++)
        {
            const float* x = bottom_blob.row(t);

            float absmax = 0.f;
            for (int i = 0; i < size; i++)
            {
                absmax = std::max(absmax, (float)fabs(x[i]));
            }

            bottom_blob_int8_scales[t] = 127.f / absmax;
        }

        Option opt_quant = opt;
        opt_quant.blob_allocator = opt.workspace_allocator;
        opt_quant.use_packing_layout = false;
        quantize_to_int8(bottom_blob, bottom_blob_int8, bottom_blob_int8_scales, opt_quant);
    }

    Mat hidden_state_int8(num_output, (size_t)1u, 1, opt.workspace_allocator);
    Mat hidden_state_int8_scales(1, (size_t)4u, 1, opt.workspace_allocator);

    // unroll
    for (int t = 0; t < T; t++)
    {
        // clip hidden by continuation indicator
        // h_cont_{t-1} = cont_t * h_{t-1}
        // h_cont_{t-1} = h_{t-1} if cont_t == 1
        //                0       otherwise
        // calculate hidden
        // gate_input_t := W_hc * h_conted_{t-1} + W_xc * x_t + b_c

        int ti = reverse ? T - 1 - t : t;

        // dynamic quantize hidden_state
        {
            float absmax = 0.f;
            for (int i = 0; i < num_output; i++)
            {
                absmax = std::max(absmax, (float)fabs(hidden_state[i]));
            }

            if (absmax == 0.f)
            {
                hidden_state_int8_scales[0] = 1.f;
                hidden_state_int8.fill<signed char>(0);
            }
            else
            {
                hidden_state_int8_scales[0] = 127.f / absmax;

                Option opt_quant = opt;
                opt_quant.blob_allocator = opt.workspace_allocator;
                opt_quant.use_packing_layout = false;
                quantize_to_int8(hidden_state, hidden_state_int8, hidden_state_int8_scales, opt_quant);
            }
        }

        const signed char* x = bottom_blob_int8.row<const signed char>(ti);
        const signed char* hs = hidden_state_int8;
        const float descale_x = 1.f / bottom_blob_int8_scales[ti];
        const float descale_h = 1.f / hidden_state_int8_scales[0];
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < hidden_size; q++)
        {
            const float* bias_c_I = bias_c.row(0);
            const float* bias_c_F = bias_c.row(1);
            const float* bias_c_O = bias_c.row(2);
            const float* bias_c_G = bias_c.row(3);

            float* gates_data = gates.row(q);

            // gate I F O G
            const signed char* weight_xc_int8_I = weight_xc_int8.row<const signed char>(hidden_size * 0 + q);
            const signed char* weight_xc_int8_F = weight_xc_int8.row<const signed char>(hidden_size * 1 + q);
            const signed char* weight_xc_int8_O = weight_xc_int8.row<const signed char>(hidden_size * 2 + q);
            const signed char* weight_xc_int8_G = weight_xc_int8.row<const signed char>(hidden_size * 3 + q);

            const signed char* weight_hc_int8_I = weight_hc_int8.row<const signed char>(hidden_size * 0 + q);
            const signed char* weight_hc_int8_F = weight_hc_int8.row<const signed char>(hidden_size * 1 + q);
            const signed char* weight_hc_int8_O = weight_hc_int8.row<const signed char>(hidden_size * 2 + q);
            const signed char* weight_hc_int8_G = weight_hc_int8.row<const signed char>(hidden_size * 3 + q);

            const float descale_xc_I = 1.f / weight_xc_int8_scales[hidden_size * 0 + q];
            const float descale_xc_F = 1.f / weight_xc_int8_scales[hidden_size * 1 + q];
            const float descale_xc_O = 1.f / weight_xc_int8_scales[hidden_size * 2 + q];
            const float descale_xc_G = 1.f / weight_xc_int8_scales[hidden_size * 3 + q];
            const float descale_hc_I = 1.f / weight_hc_int8_scales[hidden_size * 0 + q];
            const float descale_hc_F = 1.f / weight_hc_int8_scales[hidden_size * 1 + q];
            const float descale_hc_O = 1.f / weight_hc_int8_scales[hidden_size * 2 + q];
            const float descale_hc_G = 1.f / weight_hc_int8_scales[hidden_size * 3 + q];

            int Ix = 0;
            int Fx = 0;
            int Ox = 0;
            int Gx = 0;
            for (int i = 0; i < size; i++)
            {
                signed char xi = x[i];

                Ix += weight_xc_int8_I[i] * xi;
                Fx += weight_xc_int8_F[i] * xi;
                Ox += weight_xc_int8_O[i] * xi;
                Gx += weight_xc_int8_G[i] * xi;
            }

            int Ih = 0;
            int Fh = 0;
            int Oh = 0;
            int Gh = 0;
            for (int i = 0; i < num_output; i++)
            {
                signed char h_cont = hs[i];

                Ih += weight_hc_int8_I[i] * h_cont;
                Fh += weight_hc_int8_F[i] * h_cont;
                Oh += weight_hc_int8_O[i] * h_cont;
                Gh += weight_hc_int8_G[i] * h_cont;
            }

            float I = bias_c_I[q] + Ix * (descale_x * descale_xc_I) + Ih * (descale_h * descale_hc_I);
            float F = bias_c_F[q] + Fx * (descale_x * descale_xc_F) + Fh * (descale_h * descale_hc_F);
            float O = bias_c_O[q] + Ox * (descale_x * descale_xc_O) + Oh * (descale_h * descale_hc_O);
            float G = bias_c_G[q] + Gx * (descale_x * descale_xc_G) + Gh * (descale_h * descale_hc_G);

            gates_data[0] = I;
            gates_data[1] = F;
            gates_data[2] = O;
            gates_data[3] = G;
        }

        // lstm unit
        // sigmoid(I)
        // sigmoid(F)
        // sigmoid(O)
        // tanh(G)
        // c_t := f_t .* c_{t-1} + i_t .* g_t
        // h_t := o_t .* tanh[c_t]
        float* output_data = top_blob.row(ti);
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < hidden_size; q++)
        {
            const float* gates_data = gates.row(q);

            float I = gates_data[0];
            float F = gates_data[1];
            float O = gates_data[2];
            float G = gates_data[3];

            I = 1.f / (1.f + expf(-I));
            F = 1.f / (1.f + expf(-F));
            O = 1.f / (1.f + expf(-O));
            G = tanhf(G);

            float cell2 = F * cell_state[q] + I * G;
            float H = O * tanhf(cell2);
            cell_state[q] = cell2;

            if (num_output == hidden_size)
            {
                hidden_state[q] = H;
                output_data[q] = H;
            }
            else
            {
                tmp_hidden_state[q] = H;
            }
        }

        if (num_output != hidden_size)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < num_output; q++)
            {
                const float* hr = weight_hr.row(q);

                float H = 0;
                for (int i = 0; i < hidden_size; i++)
                {
                    H += tmp_hidden_state[i] * hr[i];
                }

                hidden_state[q] = H;
                output_data[q] = H;
            }
        }
    }

    return 0;
}